

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.hpp
# Opt level: O0

void apply_saturation(vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list,float saturation_val)

{
  bool bVar1;
  ostream *poVar2;
  reference m;
  int in_R8D;
  _InputArray local_270;
  _InputArray local_258;
  Mat local_240 [356];
  float local_dc;
  undefined1 local_d8 [4];
  float factor;
  _InputArray local_b0;
  Mat local_98 [8];
  Mat hsv;
  Mat *img;
  iterator __end1;
  iterator __begin1;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *__range1;
  float saturation_val_local;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)color::blue_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"Changing Saturation : ");
  std::operator<<(poVar2,(string *)color::reset_abi_cxx11_);
  __end1 = CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::begin(image_list);
  img = (Mat *)CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::end(image_list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>
                                *)&img);
    if (!bVar1) break;
    m = __gnu_cxx::__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
        operator*(&__end1);
    cv::Mat::Mat(local_98);
    cv::_InputArray::_InputArray(&local_b0,m);
    cv::_OutputArray::_OutputArray((_OutputArray *)local_d8,local_98);
    cv::cvtColor((cv *)&local_b0,(_InputArray *)local_d8,(_OutputArray *)0x28,0,in_R8D);
    cv::_OutputArray::~_OutputArray((_OutputArray *)local_d8);
    cv::_InputArray::~_InputArray(&local_b0);
    local_dc = saturation_val;
    cv::operator*(local_240,(double)saturation_val);
    cv::Mat::operator=(local_98,(MatExpr *)local_240);
    cv::MatExpr::~MatExpr((MatExpr *)local_240);
    cv::_InputArray::_InputArray(&local_258,local_98);
    cv::_OutputArray::_OutputArray((_OutputArray *)&local_270,m);
    cv::cvtColor((cv *)&local_258,&local_270,(_OutputArray *)0x36,0,in_R8D);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&local_270);
    cv::_InputArray::~_InputArray(&local_258);
    cv::Mat::~Mat(local_98);
    __gnu_cxx::__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
    operator++(&__end1);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)color::green_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"Done");
  poVar2 = std::operator<<(poVar2,(string *)color::reset_abi_cxx11_);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void apply_saturation(std::vector<cv::Mat> &image_list, float saturation_val) {
   std::cout << color::blue << "Changing Saturation : " << color::reset;
   for(auto &img : image_list) {
      Mat hsv;
      cvtColor(img, hsv, COLOR_BGR2HSV);
      float factor = saturation_val;
      hsv = hsv * factor;
      cvtColor(hsv, img, COLOR_HSV2BGR);
   }
   std::cout << color::green << "Done" <<color::reset<<std::endl;
}